

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  string output;
  string input;
  string e_1;
  string regex;
  string outvar;
  RegularExpression re;
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  char *local_100;
  undefined8 local_f8;
  char local_f0 [16];
  RegularExpression local_e0;
  
  std::__cxx11::string::string
            ((string *)&local_160,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string
            ((string *)&local_120,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3));
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_e0.program = (char *)0x0;
  bVar1 = cmsys::RegularExpression::compile(&local_e0,local_160._M_dataplus._M_p);
  if (!bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   "sub-command REGEX, mode MATCH failed to compile regex \"",&local_160);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   "\".");
    std::__cxx11::string::~string((string *)local_1c0);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0[0]._M_local_buf);
    bVar1 = false;
    goto LAB_003d0401;
  }
  local_1c0._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1c0._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 4;
  local_100 = local_f0;
  local_f8 = 0;
  local_f0[0] = '\0';
  cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((string *)local_1a0,
             (Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1c0,local_100);
  std::__cxx11::string::~string((string *)&local_100);
  local_1c0._0_8_ = local_1c0 + 0x10;
  local_1c0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c0[0x10] = '\0';
  bVar1 = cmsys::RegularExpression::find(&local_e0,(char *)local_1a0[0]._0_8_);
  if (bVar1) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_e0);
    if (local_e0.endp[0] != local_e0.startp[0]) {
      std::__cxx11::string::substr((ulong)&local_180,(ulong)local_1a0);
      std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      goto LAB_003d0384;
    }
    std::operator+(&local_140,"sub-command REGEX, mode MATCH regex \"",&local_160);
    std::operator+(&local_180,&local_140,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_140);
    cmCommand::SetError(&this->super_cmCommand,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    bVar1 = false;
  }
  else {
LAB_003d0384:
    bVar1 = true;
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_120,(char *)local_1c0._0_8_);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1a0[0]._M_local_buf);
LAB_003d0401:
  cmsys::RegularExpression::~RegularExpression(&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_160);
  return bVar1;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \""+regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if(re.find(input.c_str()))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e =
        "sub-command REGEX, mode MATCH regex \""+regex+
        "\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    output = input.substr(l, r-l);
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}